

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.c
# Opt level: O0

void write_ppm(char *filename,IceTUByte *image,int width,int height)

{
  FILE *__stream;
  IceTUByte *local_38;
  uchar *color;
  int y;
  int x;
  FILE *fd;
  int height_local;
  int width_local;
  IceTUByte *image_local;
  char *filename_local;
  
  __stream = fopen(filename,"wb");
  fprintf(__stream,"P6\n");
  fprintf(__stream,"# %s generated by IceT test suite.\n",filename);
  fprintf(__stream,"%d %d\n",(ulong)(uint)width,(ulong)(uint)height);
  fprintf(__stream,"255\n");
  for (color._0_4_ = height + -1; -1 < (int)color; color._0_4_ = (int)color + -1) {
    local_38 = image + (int)color * width * 4;
    for (color._4_4_ = 0; color._4_4_ < width; color._4_4_ = color._4_4_ + 1) {
      fwrite(local_38,1,3,__stream);
      local_38 = local_38 + 4;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void write_ppm(const char *filename,
               const IceTUByte *image,
               int width, int height)
{
    FILE *fd;
    int x, y;
    const unsigned char *color;

    fd = fopen(filename, "wb");

    fprintf(fd, "P6\n");
    fprintf(fd, "# %s generated by IceT test suite.\n", filename);
    fprintf(fd, "%d %d\n", width, height);
    fprintf(fd, "255\n");

    for (y = height-1; y >= 0; y--) {
        color = image + y*width*4;
        for (x = 0; x < width; x++) {
            fwrite(color, 1, 3, fd);
            color += 4;
        }
    }

    fclose(fd);
}